

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facets.cpp
# Opt level: O0

int main(void)

{
  PersonAddressBuilder *pPVar1;
  PersonBuilder *pPVar2;
  PersonWorkBuilder *pPVar3;
  ostream *this;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  PersonBuilder local_2e0;
  PersonAddressBuilder local_228;
  PersonWorkBuilder local_170;
  undefined1 local_b8 [8];
  Person p;
  
  p._164_4_ = 0;
  Person::create();
  PersonBuilder::lives(&local_228,&local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"Beverly Hills, Rodeo Drive",&local_311);
  pPVar1 = PersonAddressBuilder::at(&local_228,&local_310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"90210",&local_339);
  pPVar1 = PersonAddressBuilder::with_postcode(pPVar1,&local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Los Angeles",&local_361);
  pPVar2 = &PersonAddressBuilder::in(pPVar1,&local_360)->super_PersonBuilder;
  PersonBuilder::works(&local_170,pPVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"SoftwareCorp",&local_389)
  ;
  pPVar3 = PersonWorkBuilder::at(&local_170,&local_388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"Software Engineer",&local_3b1);
  pPVar3 = PersonWorkBuilder::as_a(pPVar3,&local_3b0);
  pPVar2 = &PersonWorkBuilder::earning(pPVar3,10000000)->super_PersonBuilder;
  PersonBuilder::operator_cast_to_Person((Person *)local_b8,pPVar2);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  PersonWorkBuilder::~PersonWorkBuilder(&local_170);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  PersonAddressBuilder::~PersonAddressBuilder(&local_228);
  PersonBuilder::~PersonBuilder(&local_2e0);
  this = operator<<((ostream *)&std::cout,(Person *)local_b8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  p._164_4_ = 0;
  Person::~Person((Person *)local_b8);
  return p._164_4_;
}

Assistant:

int main()
{
	Person p(Person::create()
		.lives().at("Beverly Hills, Rodeo Drive").with_postcode("90210").in("Los Angeles")
		.works().at("SoftwareCorp").as_a("Software Engineer").earning(int(10e6)));
	std::cout << p << std::endl;

	return 0;
}